

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  uint maxSymbolValue_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  void *dst_00;
  uint uVar10;
  S16 norm [256];
  U32 count [256];
  uint local_65c;
  void *local_658;
  size_t local_650;
  ulong local_648;
  uint *local_640;
  short local_638 [256];
  uint local_438 [258];
  
  iVar2 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar8 = 0x400;
  if (0xc < tableLog) {
    iVar8 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar8 + iVar2 + maxSymbolValue * 2 + 3) {
    return 0xfffffffffffffffb;
  }
  if (srcSize < 2) {
    return 0;
  }
  local_648 = (ulong)(iVar2 + maxSymbolValue * 2 + 3);
  local_640 = (uint *)((long)workSpace + local_648 * 4);
  local_65c = maxSymbolValue;
  if (maxSymbolValue == 0) {
    local_65c = 0xff;
  }
  uVar10 = 0xb;
  if (tableLog != 0) {
    uVar10 = tableLog;
  }
  local_650 = dstSize;
  sVar5 = HIST_count_wksp(local_438,&local_65c,src,srcSize,local_640);
  maxSymbolValue_00 = local_65c;
  if (sVar5 < 0xfffffffffffffff8) {
    if (sVar5 != srcSize) {
      bVar1 = sVar5 != 1 && srcSize >> 7 <= sVar5;
      sVar5 = 0;
      goto LAB_0018716c;
    }
    sVar5 = 1;
  }
  bVar1 = false;
LAB_0018716c:
  sVar6 = sVar5;
  if (bVar1) {
    uVar3 = (int)srcSize - 1;
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar3 = 0x1d - (uVar4 ^ 0x1f);
    uVar9 = 0x20 - (uVar4 ^ 0x1f);
    uVar4 = 0x1f;
    if (local_65c != 0) {
      for (; local_65c >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0xffffffe0) + 0x22;
    if (uVar9 < uVar4) {
      uVar4 = uVar9;
    }
    if (uVar10 <= uVar3) {
      uVar3 = uVar10;
    }
    if (uVar3 < uVar4) {
      uVar3 = uVar4;
    }
    uVar10 = 5;
    if (5 < uVar3) {
      uVar10 = uVar3;
    }
    uVar4 = 0xc;
    if (uVar10 < 0xc) {
      uVar4 = uVar10;
    }
    local_658 = dst;
    sVar6 = FSE_normalizeCount(local_638,uVar4,local_438,srcSize,local_65c);
    if (((sVar6 < 0xfffffffffffffff8) &&
        (sVar7 = FSE_writeNCount(local_658,local_650,local_638,maxSymbolValue_00,uVar4),
        sVar6 = sVar7, sVar7 < 0xfffffffffffffff8)) &&
       (sVar6 = FSE_buildCTable_wksp
                          ((FSE_CTable *)workSpace,local_638,local_65c,uVar4,local_640,
                           wkspSize + local_648 * -4), sVar6 < 0xfffffffffffffff8)) {
      dst_00 = (void *)((long)local_658 + sVar7);
      sVar6 = FSE_compress_usingCTable(dst_00,local_650 - sVar7,src,srcSize,(FSE_CTable *)workSpace)
      ;
      if (sVar6 < 0xfffffffffffffff8) {
        if (sVar6 == 0) {
          bVar1 = false;
          sVar6 = 0;
        }
        else {
          dst_00 = (void *)((long)dst_00 + sVar6);
          bVar1 = true;
          sVar6 = sVar5;
        }
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
        sVar6 = 0;
        if ((ulong)((long)dst_00 - (long)local_658) < srcSize - 1) {
          sVar6 = (long)dst_00 - (long)local_658;
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    U32   count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, (unsigned*)scratchBuffer) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}